

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# History.cpp
# Opt level: O1

void __thiscall
History::History(History *this,int numberOfAssignments,int numberOfWorkingWeekends,
                int numberOfConsecutiveAssignments,int numberOfConsecutiveWorkingDays,
                int numberOfConsecutiveDaysOff,string *lastAssignedShiftType)

{
  pointer pcVar1;
  
  this->numberOfAssignments = numberOfAssignments;
  this->numberOfWorkingWeekends = numberOfWorkingWeekends;
  this->numberOfConsecutiveAssignments = numberOfConsecutiveAssignments;
  this->numberOfConsecutiveWorkingDays = numberOfConsecutiveWorkingDays;
  this->numberOfConsecutiveDaysOff = numberOfConsecutiveDaysOff;
  (this->lastAssignedShiftType)._M_dataplus._M_p = (pointer)&(this->lastAssignedShiftType).field_2;
  pcVar1 = (lastAssignedShiftType->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lastAssignedShiftType,pcVar1,
             pcVar1 + lastAssignedShiftType->_M_string_length);
  return;
}

Assistant:

History::History(int numberOfAssignments, int numberOfWorkingWeekends, int numberOfConsecutiveAssignments,
                 int numberOfConsecutiveWorkingDays, int numberOfConsecutiveDaysOff,
                 const string &lastAssignedShiftType) : numberOfAssignments(numberOfAssignments),
                                                        numberOfWorkingWeekends(numberOfWorkingWeekends),
                                                        numberOfConsecutiveAssignments(numberOfConsecutiveAssignments),
                                                        numberOfConsecutiveWorkingDays(numberOfConsecutiveWorkingDays),
                                                        numberOfConsecutiveDaysOff(numberOfConsecutiveDaysOff),
                                                        lastAssignedShiftType(lastAssignedShiftType) {}